

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void display_object(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  uint8_t attr_00;
  uint8_t a_00;
  _Bool _Var1;
  wchar_t c_00;
  object_kind *kind_00;
  byte local_81;
  wchar_t c;
  uint8_t a;
  uint8_t attr;
  _Bool aware;
  char o_name [80];
  char *inscrip;
  object_kind *kind;
  wchar_t oid_local;
  _Bool cursor_local;
  wchar_t row_local;
  wchar_t col_local;
  
  kind_00 = k_info + oid;
  o_name._72_8_ = get_autoinscription(kind_00,(_Bool)(kind_00->aware & 1));
  local_81 = 1;
  if (kind_00->flavor != (flavor *)0x0) {
    local_81 = kind_00->aware;
  }
  local_81 = local_81 & 1;
  attr_00 = curs_attrs[(int)(uint)local_81][(int)(uint)cursor];
  a_00 = object_kind_attr(kind_00);
  c_00 = object_kind_char(kind_00);
  _Var1 = flag_has_dbg(kind_00->kind_flags,2,4,"kind->kind_flags","KF_INSTA_ART");
  if (!_Var1) {
    object_kind_name((char *)&c,0x50,kind_00,(_Bool)((player->opts).opt[0x1a] & 1));
  }
  if (((kind_00->tried & 1U) != 0) && (local_81 == 0)) {
    my_strcat((char *)&c," {tried}",0x50);
  }
  c_prt(attr_00,(char *)&c,row,col);
  if (((local_81 != 0) && (_Var1 = kind_is_ignored_aware(kind_00), _Var1)) ||
     ((local_81 == 0 && (_Var1 = kind_is_ignored_unaware(kind_00), _Var1)))) {
    c_put_str(attr_00,"Yes",row,L'.');
  }
  if (o_name._72_8_ != 0) {
    c_put_str('\v',(char *)o_name._72_8_,row,L'7');
  }
  if (tile_height == '\x01') {
    big_pad(L'L',row,a_00,c_00);
  }
  return;
}

Assistant:

static void display_object(int col, int row, bool cursor, int oid)
{
	struct object_kind *kind = &k_info[oid];
	const char *inscrip = get_autoinscription(kind, kind->aware);

	char o_name[80];

	/* Choose a color */
	bool aware = (!kind->flavor || kind->aware);
	uint8_t attr = curs_attrs[(int)aware][(int)cursor];

	/* Graphics versions of the object_char and object_attr defines */
	uint8_t a = object_kind_attr(kind);
	wchar_t c = object_kind_char(kind);

	/* Don't display special artifacts */
	if (!kf_has(kind->kind_flags, KF_INSTA_ART))
 		object_kind_name(o_name, sizeof(o_name), kind, OPT(player, cheat_xtra));

	/* If the type is "tried", display that */
	if (kind->tried && !aware)
		my_strcat(o_name, " {tried}", sizeof(o_name));

	/* Display the name */
	c_prt(attr, o_name, row, col);

	/* Show ignore status */
	if ((aware && kind_is_ignored_aware(kind)) ||
		(!aware && kind_is_ignored_unaware(kind)))
		c_put_str(attr, "Yes", row, 46);


	/* Show autoinscription if around */
	if (inscrip)
		c_put_str(COLOUR_YELLOW, inscrip, row, 55);

	if (tile_height == 1) {
		big_pad(76, row, a, c);
	}
}